

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_0::expectSourceInfo
          (anon_unknown_0 *this,Reader sourceInfo,uint64_t expectedId,StringPtr expectedComment,
          initializer_list<const_kj::StringPtr> expectedMembers)

{
  StringPtr *other;
  iterator pSVar1;
  Iterator __begin2;
  iterator pSVar2;
  uint64_t expectedId_local;
  Reader members;
  ArrayPtr<const_char> local_b0;
  StringPtr expectedComment_local;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_2;
  bool local_68;
  Fault f;
  
  pSVar1 = expectedMembers._M_array;
  other = (StringPtr *)expectedComment.content.size_;
  expectedComment_local.content.size_ = (size_t)expectedComment.content.ptr;
  if (sourceInfo._reader.dataSize < 0x40) {
    members.reader.segment = (SegmentReader *)0x0;
  }
  else {
    members.reader.segment = *sourceInfo._reader.data;
  }
  members.reader.capTable = (CapTableReader *)&expectedId_local;
  members.reader.ptr = " == ";
  members.reader.elementCount = 5;
  members.reader.step = 0;
  members.reader.structDataSize._0_1_ = members.reader.segment == (SegmentReader *)this;
  expectedId_local = (uint64_t)this;
  expectedComment_local.content.ptr = (char *)expectedId;
  if ((!(bool)(undefined1)members.reader.structDataSize) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,capnp::schema::Node::SourceInfo::Reader&,unsigned_long&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"sourceInfo.getId() == expectedId\", _kjCondition, sourceInfo, expectedId"
               ,(char (*) [50])"failed: expected sourceInfo.getId() == expectedId",
               (DebugComparison<unsigned_long,_unsigned_long_&> *)&members,&sourceInfo,
               (unsigned_long *)members.reader.capTable);
  }
  _kjCondition_2._0_16_ = capnp::schema::Node::SourceInfo::Reader::getDocComment(&sourceInfo);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)&members,
             (DebugExpression<capnp::Text::Reader> *)&_kjCondition_2,&expectedComment_local);
  if (((char)members.reader.nestingLimit == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&,capnp::schema::Node::SourceInfo::Reader&,kj::StringPtr&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"sourceInfo.getDocComment() == expectedComment\", _kjCondition, sourceInfo, expectedComment"
               ,(char (*) [63])"failed: expected sourceInfo.getDocComment() == expectedComment",
               (DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)&members,&sourceInfo,
               &expectedComment_local);
  }
  capnp::schema::Node::SourceInfo::Reader::getMembers(&members,&sourceInfo);
  _kjCondition_2.left = members.reader.elementCount;
  _kjCondition_2.right = (unsigned_long)pSVar1;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = (iterator)(members.reader._24_8_ & 0xffffffff) == pSVar1;
  if (_kjCondition_2.result) {
    for (pSVar2 = (iterator)0x0; pSVar1 != pSVar2;
        pSVar2 = (iterator)((long)&(pSVar2->content).ptr + 1)) {
      capnp::_::ListReader::getStructElement
                ((StructReader *)&f,&members.reader,(ElementCount)pSVar2);
      local_b0 = (ArrayPtr<const_char>)
                 capnp::schema::Node::SourceInfo::Member::Reader::getDocComment((Reader *)&f);
      kj::_::DebugExpression<capnp::Text::Reader>::operator==
                ((DebugComparison<capnp::Text::Reader,_const_kj::StringPtr_&> *)&_kjCondition_2,
                 (DebugExpression<capnp::Text::Reader> *)&local_b0,other);
      if ((local_68 == false) && (kj::_::Debug::minSeverity < 3)) {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&f,&members.reader,(ElementCount)pSVar2);
        kj::_::Debug::
        log<char_const(&)[74],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr_const&>&,capnp::schema::Node::SourceInfo::Member::Reader,kj::StringPtr_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                   ,0xcf,ERROR,
                   "\"failed: expected \" \"members[i].getDocComment() == expectedMembers.begin()[i]\", _kjCondition, members[i], expectedMembers.begin()[i]"
                   ,(char (*) [74])
                    "failed: expected members[i].getDocComment() == expectedMembers.begin()[i]",
                   (DebugComparison<capnp::Text::Reader,_const_kj::StringPtr_&> *)&_kjCondition_2,
                   (Reader *)&f,other);
      }
      other = other + 1;
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
             ,0xcc,FAILED,"members.size() == expectedMembers.size()","_kjCondition,",&_kjCondition_2
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void expectSourceInfo(schema::Node::SourceInfo::Reader sourceInfo,
                   uint64_t expectedId, kj::StringPtr expectedComment,
                   std::initializer_list<const kj::StringPtr> expectedMembers) {
  KJ_EXPECT(sourceInfo.getId() == expectedId, sourceInfo, expectedId);
  KJ_EXPECT(sourceInfo.getDocComment() == expectedComment, sourceInfo, expectedComment);

  auto members = sourceInfo.getMembers();
  KJ_ASSERT(members.size() == expectedMembers.size());
  for (auto i: kj::indices(expectedMembers)) {
    KJ_EXPECT(members[i].getDocComment() == expectedMembers.begin()[i],
              members[i], expectedMembers.begin()[i]);
  }
}